

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

vm_obj_id_t __thiscall find_ctx::results_to_list(find_ctx *this)

{
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  int iVar4;
  find_entry_page *pfVar5;
  find_entry *pfVar6;
  size_t idx;
  long lVar7;
  vm_val_t ele;
  vm_val_t local_40;
  
  vVar2 = CVmObjList::create(0,(long)this->result_cnt * 2);
  pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
  iVar3 = this->result_cnt;
  pfVar5 = (find_entry_page *)this;
  for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + (uint)lVar7) {
    pfVar5 = pfVar5->nxt;
    pfVar6 = pfVar5->entry;
    idx = (long)iVar4 * 2;
    for (lVar7 = 0; (lVar7 + iVar4 < (long)iVar3 && ((uint)lVar7 < 0x20)); lVar7 = lVar7 + 1) {
      local_40.val.obj = pfVar6->obj;
      local_40.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)(pCVar1 + (vVar2 & 0xfff)),idx,&local_40);
      CVmObjList::cons_set_element
                ((CVmObjList *)(pCVar1 + (vVar2 & 0xfff)),idx + 1,&pfVar6->match_result);
      iVar3 = this->result_cnt;
      idx = idx + 2;
      pfVar6 = pfVar6 + 1;
    }
  }
  return vVar2;
}

Assistant:

vm_obj_id_t results_to_list(VMG0_)
    {
        vm_obj_id_t lst_id;
        CVmObjList *lst;
        find_entry_page *pg;
        int idx;
        
        /* 
         *   Allocate a list of the appropriate size.  We need two list
         *   entries per result, since we need to store the object and the
         *   match result code for each result.  
         */
        lst_id = CVmObjList::create(vmg_ FALSE, result_cnt * 2);
        lst = (CVmObjList *)vm_objp(vmg_ lst_id);

        /* add all entries */
        for (idx = 0, pg = results_head ; idx < result_cnt ; pg = pg->nxt)
        {
            find_entry *ep;
            int pg_idx;
            
            /* add each entry on this page */
            for (ep = pg->entry, pg_idx = 0 ;
                 idx < result_cnt && pg_idx < FIND_ENTRIES_PER_PAGE ;
                 ++idx, ++pg_idx, ++ep)
            {
                vm_val_t ele;
                    
                /* add this entry to the list */
                ele.set_obj(ep->obj);
                lst->cons_set_element(idx*2, &ele);
                lst->cons_set_element(idx*2 + 1, &ep->match_result);
            }
        }

        /* return the list */
        return lst_id;
    }